

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_ModifyMonitoredItems
               (UA_Server *server,UA_Session *session,UA_ModifyMonitoredItemsRequest *request,
               UA_ModifyMonitoredItemsResponse *response)

{
  UA_MonitoredItemModifyRequest *pUVar1;
  UA_StatusCode UVar2;
  UA_Subscription *sub;
  UA_MonitoredItemModifyResult *pUVar3;
  UA_MonitoredItem *mon;
  ulong uVar4;
  long lVar5;
  size_t size;
  long lVar6;
  
  UVar2 = 0x802b0000;
  if (request->timestampsToReturn < 4) {
    sub = UA_Session_getSubscriptionByID(session,request->subscriptionId);
    if (sub == (UA_Subscription *)0x0) {
      UVar2 = 0x80280000;
    }
    else {
      sub->currentLifetimeCount = 0;
      size = request->itemsToModifySize;
      if (size == 0) {
        UVar2 = 0x800f0000;
      }
      else {
        pUVar3 = (UA_MonitoredItemModifyResult *)UA_Array_new(size,UA_TYPES + 0x1e);
        response->results = pUVar3;
        if (pUVar3 != (UA_MonitoredItemModifyResult *)0x0) {
          response->resultsSize = size;
          lVar6 = 8;
          lVar5 = 0x10;
          for (uVar4 = 0; uVar4 < size; uVar4 = uVar4 + 1) {
            pUVar1 = request->itemsToModify;
            pUVar3 = response->results;
            mon = UA_Subscription_getMonitoredItem(sub,*(UA_UInt32 *)((long)pUVar1 + lVar6 + -8));
            if (mon == (UA_MonitoredItem *)0x0) {
              *(undefined4 *)((long)pUVar3 + lVar5 + -0x10) = 0x80420000;
            }
            else {
              setMonitoredItemSettings
                        (server,mon,mon->monitoringMode,
                         (UA_MonitoringParameters *)((long)&pUVar1->monitoredItemId + lVar6));
              *(UA_Double *)((long)pUVar3 + lVar5 + -8) = mon->samplingInterval;
              *(UA_UInt32 *)((long)&pUVar3->statusCode + lVar5) = mon->maxQueueSize;
              size = request->itemsToModifySize;
            }
            lVar6 = lVar6 + 0x50;
            lVar5 = lVar5 + 0x48;
          }
          return;
        }
        UVar2 = 0x80030000;
      }
    }
  }
  (response->responseHeader).serviceResult = UVar2;
  return;
}

Assistant:

void Service_ModifyMonitoredItems(UA_Server *server, UA_Session *session,
                                  const UA_ModifyMonitoredItemsRequest *request,
                                  UA_ModifyMonitoredItemsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing ModifyMonitoredItemsRequest");

    /* check if the timestampstoreturn is valid */
    if(request->timestampsToReturn > UA_TIMESTAMPSTORETURN_NEITHER) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADTIMESTAMPSTORETURNINVALID;
        return;
    }

    /* Get the subscription */
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;
    if(request->itemsToModifySize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->itemsToModifySize,
                                     &UA_TYPES[UA_TYPES_MONITOREDITEMMODIFYRESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->itemsToModifySize;

    for(size_t i = 0; i < request->itemsToModifySize; ++i)
        Service_ModifyMonitoredItems_single(server, session, sub, &request->itemsToModify[i],
                                            &response->results[i]);

}